

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O2

int Gia_ManCountPosWithNonZeroDrivers(Gia_Man_t *p)

{
  int iVar1;
  Gia_Obj_t *pObj;
  int v;
  int iVar2;
  
  v = 0;
  iVar2 = 0;
  while( true ) {
    if (p->vCos->nSize <= v) {
      return iVar2;
    }
    pObj = Gia_ManCo(p,v);
    if (pObj == (Gia_Obj_t *)0x0) break;
    iVar1 = Gia_ObjId(p,pObj);
    iVar1 = Abc_Var2Lit(iVar1 - (*(uint *)pObj & 0x1fffffff),*(uint *)pObj >> 0x1d & 1);
    iVar2 = (iVar2 + 1) - (uint)(iVar1 == 0);
    v = v + 1;
  }
  return iVar2;
}

Assistant:

int Gia_ManCountPosWithNonZeroDrivers( Gia_Man_t * p )
{
    Gia_Obj_t * pObj; 
    int i, Count = 0;
    Gia_ManForEachCo( p, pObj, i )
        Count += Gia_ObjFaninLit0(pObj, Gia_ObjId(p, pObj)) != 0;
    return Count;
}